

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O3

bool __thiscall EncodingTable::load(EncodingTable *this,path *fileName,Encoding encoding)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  string hex;
  string value;
  uchar hexBuffer [32];
  TextFile input;
  string local_378;
  string local_358;
  string local_338;
  uchar local_318 [32];
  TextFile local_2f8;
  
  TextFile::TextFile(&local_2f8);
  iVar3 = TextFile::open(&local_2f8,(char *)fileName,0,(ulong)encoding);
  if ((char)iVar3 != '\0') {
    (this->hexData).size_ = 0;
    pTVar1 = (this->entries).
             super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->entries).
        super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
      (this->entries).
      super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = pTVar1;
    }
    sVar5 = ByteArray::append(&this->hexData,"",1);
    (this->terminationEntry).hexPos = sVar5;
    (this->terminationEntry).hexLen = 1;
    (this->terminationEntry).valueLen = 0;
    while( true ) {
      bVar2 = TextFile::atEnd(&local_2f8);
      if (bVar2) break;
      TextFile::readLine_abi_cxx11_(&local_338,&local_2f8);
      if ((local_338._M_string_length != 0) && (*local_338._M_dataplus._M_p != '*')) {
        if (*local_338._M_dataplus._M_p == '/') {
          std::__cxx11::string::substr((ulong)&local_378,(ulong)&local_338);
          if ((0xffffffffffffffbf < local_378._M_string_length - 0x41) &&
             (iVar4 = parseHexString(&local_378,local_318), iVar4 != -1)) {
            sVar5 = ByteArray::append(&this->hexData,local_318,(long)iVar4);
            (this->terminationEntry).hexPos = sVar5;
            (this->terminationEntry).hexLen = (long)iVar4;
            (this->terminationEntry).valueLen = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_0014f546;
          }
        }
        else {
          std::__cxx11::string::find((char)&local_338,0x3d);
          std::__cxx11::string::substr((ulong)&local_378,(ulong)&local_338);
          std::__cxx11::string::substr((ulong)&local_358,(ulong)&local_338);
          if (((0xffffffffffffffbf < local_378._M_string_length - 0x41) &&
              (local_358._M_string_length != 0)) &&
             (iVar4 = parseHexString(&local_378,local_318), iVar4 != -1)) {
            addEntry(this,local_318,(long)iVar4,&local_358);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
      }
LAB_0014f546:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
    }
  }
  TextFile::~TextFile(&local_2f8);
  return (bool)(char)iVar3;
}

Assistant:

bool EncodingTable::load(const fs::path& fileName, TextFile::Encoding encoding)
{
	unsigned char hexBuffer[MAXHEXLENGTH];

	TextFile input;
	if (!input.open(fileName,TextFile::Read,encoding))
		return false;

	hexData.clear();
	entries.clear();
	setTerminationEntry((unsigned char*)"\0",1);

	while (!input.atEnd())
	{
		const std::string &line = input.readLine();
		if (line.empty() || line[0] == '*') continue;
		
		if (line[0] == '/')
		{
			std::string hex = line.substr(1);
			if (hex.empty() || hex.length() > 2*MAXHEXLENGTH)
			{
				// error
				continue;
			}

			int length = parseHexString(hex,hexBuffer);
			if (length == -1)
			{
				// error
				continue;
			}

			setTerminationEntry(hexBuffer,length);
		} else {
			size_t pos = line.find(L'=');
			std::string hex = line.substr(0,pos);
			std::string value = line.substr(pos+1);

			if (hex.empty() || value.empty() || hex.length() > 2*MAXHEXLENGTH)
			{
				// error
				continue;
			}
			
			int length = parseHexString(hex,hexBuffer);
			if (length == -1)
			{
				// error
				continue;
			}

			addEntry(hexBuffer,length,value);
		}
	}

	return true;
}